

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O2

void __thiscall
chrono::ChMatterSPH::IntStateScatter
          (ChMatterSPH *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double T,
          bool full_update)

{
  uint uVar1;
  ulong uVar2;
  uint local_8c;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_68 [56];
  
  uVar1 = 0;
  local_8c = off_v;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if ((ulong)((long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar2) break;
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
               &x->super_ChVectorDynamic<double>,(ulong)off_x,3);
    ChVector<double>::operator=
              (&(((this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar2].
                  super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ChNodeXYZ).pos,local_68);
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_68,
               &v->super_ChVectorDynamic<double>,(ulong)local_8c,3);
    ChVector<double>::operator=
              (&(((this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar2].
                  super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ChNodeXYZ).pos_dt,local_68);
    local_8c = local_8c + 3;
    uVar1 = uVar1 + 1;
    off_x = off_x + 3;
  }
  (this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj.ChTime = T;
  (*(this->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x13])
            (this,(ulong)full_update);
  return;
}

Assistant:

void ChMatterSPH::IntStateScatter(const unsigned int off_x,  // offset in x state vector
                                  const ChState& x,          // state vector, position part
                                  const unsigned int off_v,  // offset in v state vector
                                  const ChStateDelta& v,     // state vector, speed part
                                  const double T,            // time
                                  bool full_update           // perform complete update
) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->pos = x.segment(off_x + 3 * j, 3);
        nodes[j]->pos_dt = v.segment(off_v + 3 * j, 3);
    }
    SetChTime(T);
    Update(T, full_update);
}